

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O1

wchar_t node__try(EditLine *el,keymacro_node_t *ptr,wchar_t *str,keymacro_value_t *val,wchar_t ntype
                 )

{
  wchar_t wVar1;
  int iVar2;
  FILE *pFVar3;
  int iVar4;
  EditLine *pEVar5;
  keymacro_node_t *pkVar6;
  
  iVar4 = (int)val;
  pkVar6 = ptr;
  do {
    wVar1 = pkVar6->ch;
    if (*(wchar_t *)&el->el_prog != wVar1) {
      do {
        pEVar5 = el;
        el = (EditLine *)pEVar5->el_errfile;
        if (el == (EditLine *)0x0) goto LAB_0010b5bc;
      } while (*(wchar_t *)&el->el_prog != wVar1);
      if (el == (EditLine *)0x0) {
LAB_0010b5bc:
        pFVar3 = (FILE *)malloc(0x20);
        if (pFVar3 == (FILE *)0x0) {
          pFVar3 = (FILE *)0x0;
        }
        else {
          pFVar3->_flags = wVar1;
          *(undefined4 *)&pFVar3->field_0x4 = 2;
          pFVar3->_IO_read_ptr = (char *)0x0;
          pFVar3->_IO_read_end = (char *)0x0;
          pFVar3->_IO_read_base = (char *)0x0;
        }
        pEVar5->el_errfile = pFVar3;
      }
      el = (EditLine *)pEVar5->el_errfile;
    }
    wVar1 = pkVar6->type;
    pEVar5 = (EditLine *)el->el_outfile;
    if (wVar1 == L'\0') break;
    if (pEVar5 == (EditLine *)0x0) {
      pFVar3 = (FILE *)malloc(0x20);
      if (pFVar3 == (FILE *)0x0) {
        pFVar3 = (FILE *)0x0;
      }
      else {
        pFVar3->_flags = wVar1;
        *(undefined4 *)&pFVar3->field_0x4 = 2;
        pFVar3->_IO_read_ptr = (char *)0x0;
        pFVar3->_IO_read_end = (char *)0x0;
        pFVar3->_IO_read_base = (char *)0x0;
      }
      el->el_outfile = pFVar3;
    }
    pkVar6 = (keymacro_node_t *)&pkVar6->type;
    el = (EditLine *)el->el_outfile;
  } while( true );
  if (pEVar5 != (EditLine *)0x0) {
    node__put(pEVar5,ptr);
    el->el_outfile = (FILE *)0x0;
  }
  iVar2 = *(int *)((long)&el->el_prog + 4);
  if ((iVar2 != 0) && (iVar2 != 2)) {
    if (iVar2 != 1) goto LAB_0010b69e;
    if (el->el_infile != (FILE *)0x0) {
      free(el->el_infile);
    }
  }
  *(int *)((long)&el->el_prog + 4) = iVar4;
  if (iVar4 == 1) {
    pFVar3 = (FILE *)wcsdup(*(wchar_t **)str);
  }
  else {
    if (iVar4 != 0) {
LAB_0010b69e:
      abort();
    }
    pFVar3 = *(FILE **)str;
  }
  el->el_infile = pFVar3;
  return (wchar_t)pFVar3;
}

Assistant:

static int
node__try(EditLine *el, keymacro_node_t *ptr, const wchar_t *str,
    keymacro_value_t *val, int ntype)
{

	if (ptr->ch != *str) {
		keymacro_node_t *xm;

		for (xm = ptr; xm->sibling != NULL; xm = xm->sibling)
			if (xm->sibling->ch == *str)
				break;
		if (xm->sibling == NULL)
			xm->sibling = node__get(*str);	/* setup new node */
		ptr = xm->sibling;
	}
	if (*++str == '\0') {
		/* we're there */
		if (ptr->next != NULL) {
			node__put(el, ptr->next);
				/* lose longer keys with this prefix */
			ptr->next = NULL;
		}
		switch (ptr->type) {
		case XK_CMD:
		case XK_NOD:
			break;
		case XK_STR:
			if (ptr->val.str)
				el_free(ptr->val.str);
			break;
		default:
			EL_ABORT((el->el_errfile, "Bad XK_ type %d\n",
			    ptr->type));
			break;
		}

		switch (ptr->type = ntype) {
		case XK_CMD:
			ptr->val = *val;
			break;
		case XK_STR:
			if ((ptr->val.str = wcsdup(val->str)) == NULL)
				return -1;
			break;
		default:
			EL_ABORT((el->el_errfile, "Bad XK_ type %d\n", ntype));
			break;
		}
	} else {
		/* still more chars to go */
		if (ptr->next == NULL)
			ptr->next = node__get(*str);	/* setup new node */
		(void) node__try(el, ptr->next, str, val, ntype);
	}
	return 0;
}